

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall WeightedReservoir_Basic_Test::TestBody(WeightedReservoir_Basic_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  AssertionResult gtest_ar;
  float weights [16];
  atomic<int> count [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  float local_f4;
  float local_f0 [2];
  internal local_e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  undefined1 local_d8 [16];
  _Manager_type p_Stack_c8;
  code *pcStack_c0;
  float local_b8 [16];
  undefined1 local_78 [64];
  
  lVar3 = 0;
  uVar5 = 0x853c49e6748fea9b;
  do {
    uVar6 = (uint)(uVar5 >> 0x2d) ^ (uint)(uVar5 >> 0x1b);
    bVar4 = (byte)(uVar5 >> 0x3b);
    auVar1._8_8_ = in_XMM4_Qb;
    auVar1._0_8_ = in_XMM4_Qa;
    auVar1 = vcvtusi2ss_avx512f(auVar1,uVar6 >> bVar4 | uVar6 << 0x20 - bVar4);
    auVar1 = vminss_avx(ZEXT416((uint)(auVar1._0_4_ * 2.3283064e-10)),SUB6416(ZEXT464(0x3f7fffff),0)
                       );
    local_b8[lVar3] = auVar1._0_4_ * auVar1._0_4_ + 0.05;
    lVar3 = lVar3 + 1;
    uVar5 = uVar5 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
  } while (lVar3 != 0x10);
  local_78 = ZEXT1264(ZEXT812(0));
  local_d8._8_8_ = local_78;
  local_d8._0_8_ = local_b8;
  p_Stack_c8 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:1010:29)>
               ::_M_manager;
  pcStack_c0 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:1010:29)>
               ::_M_invoke;
  pbrt::ParallelFor(0,1000000,(function<void_(long,_long)> *)local_d8);
  if (p_Stack_c8 != (_Manager_type)0x0) {
    (*p_Stack_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
  }
  local_f4 = 0.0;
  lVar3 = 0;
  do {
    local_f4 = local_f4 + *(float *)((long)local_b8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  lVar3 = 0;
  do {
    local_100.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((double)*(int *)(local_78 + lVar3 * 4) * 0.97) / 1000000.0);
    local_f0[0] = local_b8[lVar3] / local_f4;
    testing::internal::CmpHelperLE<double,float>
              (local_e8,".97 * count[i] / double(nTrials)","weights[i] / sumW",(double *)&local_100,
               local_f0);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      pcVar7 = "";
      if (local_e0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_e0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x410,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
      if (local_100.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_100.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_100.ptr_ + 8))();
        }
        local_100.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_100.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((double)*(int *)(local_78 + lVar3 * 4) * 1.03) / 1000000.0);
    local_f0[0] = local_b8[lVar3] / local_f4;
    testing::internal::CmpHelperGE<double,float>
              (local_e8,"1.03 * count[i] / double(nTrials)","weights[i] / sumW",(double *)&local_100
               ,local_f0);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      pcVar7 = "";
      if (local_e0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_e0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x411,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
      if (local_100.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_100.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_100.ptr_ + 8))();
        }
        local_100.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  return;
}

Assistant:

TEST(WeightedReservoir, Basic) {
    RNG rng;
    constexpr int n = 16;
    float weights[n];
    for (int i = 0; i < n; ++i)
        weights[i] = .05 + Sqr(rng.Uniform<Float>());

    std::atomic<int> count[n] = {};
    int64_t nTrials = 1000000;
    ParallelFor(0, nTrials, [&](int64_t start, int64_t end) {
#ifdef PBRT_IS_MSVC
        // MSVC2019 doesn't seem to capture this as constexpr...
        constexpr int n = 16;
#endif
        RNG rng(3 * start);
        int localCount[n] = {};

        for (int64_t i = start; i < end; ++i) {
            WeightedReservoirSampler<int> wrs(i);
            int perm[n];
            for (int j = 0; j < n; ++j)
                perm[j] = j;

            for (int j = 0; j < n; ++j) {
                int index = perm[j];
                wrs.Add(index, weights[index]);
            }

            int index = wrs.GetSample();
            ASSERT_TRUE(index >= 0 && index < n);
            ++localCount[index];
        }

        for (int i = 0; i < n; ++i)
            count[i] += localCount[i];
    });

    Float sumW = std::accumulate(std::begin(weights), std::end(weights), Float(0));
    for (int i = 0; i < n; ++i) {
        EXPECT_LE(.97 * count[i] / double(nTrials), weights[i] / sumW);
        EXPECT_GE(1.03 * count[i] / double(nTrials), weights[i] / sumW);
    }
}